

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgGridGlobal.cpp
# Opt level: O3

void __thiscall
TasGrid::GridGlobal::loadConstructedPoint(GridGlobal *this,double *x,int numx,double *y)

{
  DynamicConstructorDataGlobal *pDVar1;
  AddPointResult AVar2;
  _Fwd_list_impl _Var3;
  ulong uVar4;
  double dVar5;
  double dVar6;
  vector<int,_std::allocator<int>_> idx;
  allocator_type local_a9;
  int *local_a8 [2];
  long local_98;
  _Any_data local_90;
  code *local_80;
  code *local_78;
  OneDimensionalWrapper *local_70;
  long local_68;
  long local_60;
  double *local_58;
  double *local_50;
  vector<int,_std::allocator<int>_> local_48;
  
  local_58 = x;
  local_50 = y;
  if (0 < numx) {
    local_60 = (long)(this->super_BaseCanonicalGrid).num_dimensions;
    local_68 = (long)(this->super_BaseCanonicalGrid).num_outputs;
    local_70 = &this->wrapper;
    uVar4 = 0;
    do {
      getMultiIndex(&local_48,this,local_58 + uVar4 * local_60);
      pDVar1 = (this->dynamic_values)._M_t.
               super___uniq_ptr_impl<TasGrid::DynamicConstructorDataGlobal,_std::default_delete<TasGrid::DynamicConstructorDataGlobal>_>
               ._M_t.
               super__Tuple_impl<0UL,_TasGrid::DynamicConstructorDataGlobal_*,_std::default_delete<TasGrid::DynamicConstructorDataGlobal>_>
               .super__Head_base<0UL,_TasGrid::DynamicConstructorDataGlobal_*,_false>._M_head_impl;
      ::std::vector<double,std::allocator<double>>::vector<double_const*,void>
                ((vector<double,std::allocator<double>> *)local_a8,local_50 + uVar4 * local_68,
                 local_50 + uVar4 * local_68 + (this->super_BaseCanonicalGrid).num_outputs,&local_a9
                );
      AVar2 = DynamicConstructorDataGlobal::addNewNode
                        (pDVar1,&local_48,(vector<double,_std::allocator<double>_> *)local_a8);
      if (local_a8[0] != (int *)0x0) {
        operator_delete(local_a8[0],local_98 - (long)local_a8[0]);
      }
      if (AVar2 == tensor_missing) {
        pDVar1 = (this->dynamic_values)._M_t.
                 super___uniq_ptr_impl<TasGrid::DynamicConstructorDataGlobal,_std::default_delete<TasGrid::DynamicConstructorDataGlobal>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_TasGrid::DynamicConstructorDataGlobal_*,_std::default_delete<TasGrid::DynamicConstructorDataGlobal>_>
                 .super__Head_base<0UL,_TasGrid::DynamicConstructorDataGlobal_*,_false>._M_head_impl
        ;
        OneDimensionalWrapper::getLevels
                  ((vector<int,_std::allocator<int>_> *)local_a8,local_70,&local_48);
        local_90._8_8_ = 0;
        local_78 = ::std::
                   _Function_handler<int_(int),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mkstoyanov[P]TASMANIAN/SparseGrids/tsgGridGlobal.cpp:508:70)>
                   ::_M_invoke;
        local_80 = ::std::
                   _Function_handler<int_(int),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mkstoyanov[P]TASMANIAN/SparseGrids/tsgGridGlobal.cpp:508:70)>
                   ::_M_manager;
        _Var3._M_head._M_next =
             (((this->dynamic_values)._M_t.
               super___uniq_ptr_impl<TasGrid::DynamicConstructorDataGlobal,_std::default_delete<TasGrid::DynamicConstructorDataGlobal>_>
               ._M_t.
               super__Tuple_impl<0UL,_TasGrid::DynamicConstructorDataGlobal_*,_std::default_delete<TasGrid::DynamicConstructorDataGlobal>_>
               .super__Head_base<0UL,_TasGrid::DynamicConstructorDataGlobal_*,_false>._M_head_impl)
             ->tensors).
             super__Fwd_list_base<TasGrid::TensorData,_std::allocator<TasGrid::TensorData>_>._M_impl
             ._M_head;
        dVar5 = 1.0;
        if (_Var3._M_head._M_next != (_Fwd_list_node_base)0x0) {
          dVar6 = 0.0;
          do {
            dVar5 = *(double *)((long)_Var3._M_head._M_next + 8);
            if (*(double *)((long)_Var3._M_head._M_next + 8) <= dVar6) {
              dVar5 = dVar6;
            }
            _Var3._M_head._M_next = *(_Fwd_list_node_base *)_Var3._M_head._M_next;
            dVar6 = dVar5;
          } while (_Var3._M_head._M_next != (_Fwd_list_node_base *)0x0);
          dVar5 = dVar5 + 1.0;
        }
        local_90._M_unused._M_object = this;
        DynamicConstructorDataGlobal::addTensor
                  (pDVar1,local_a8[0],(function<int_(int)> *)&local_90,dVar5);
        if (local_80 != (code *)0x0) {
          (*local_80)(&local_90,&local_90,__destroy_functor);
        }
        if (local_a8[0] != (int *)0x0) {
          operator_delete(local_a8[0],local_98 - (long)local_a8[0]);
        }
      }
      if (local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start != (pointer)0x0) {
        operator_delete(local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      uVar4 = uVar4 + 1;
    } while (uVar4 != (uint)numx);
  }
  loadConstructedTensors(this);
  return;
}

Assistant:

void GridGlobal::loadConstructedPoint(const double x[], int numx, const double y[]){
    Utils::Wrapper2D<const double> wrapx(num_dimensions, x);
    Utils::Wrapper2D<const double> wrapy(num_outputs, y);
    for(int i=0; i<numx; i++){
        std::vector<int> idx = getMultiIndex(wrapx.getStrip(i));
        if (dynamic_values->addNewNode(idx, std::vector<double>(wrapy.getStrip(i), wrapy.getStrip(i) + num_outputs))
            == DynamicConstructorDataGlobal::AddPointResult::tensor_missing){
            dynamic_values->addTensor(wrapper.getLevels(idx).data(), [&](int l)->int{ return wrapper.getNumPoints(l); },
                                      dynamic_values->getMaxTensorWeight() + 1.0);
        }
    }
    loadConstructedTensors();
}